

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fmt::v9::to_string<char,500ul>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,v9 *this,basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf)

{
  size_t sVar1;
  size_type sVar2;
  char *__s;
  allocator<char> local_55 [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_t local_28;
  size_t size;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf_local;
  undefined1 local_9;
  
  size = (size_t)this;
  buf_local = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)__return_storage_ptr__;
  sVar1 = detail::buffer<char>::size((buffer<char> *)this);
  local_28 = sVar1;
  std::__cxx11::string::string((string *)&local_48);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::max_size
                    (&local_48);
  local_9 = sVar1 < sVar2;
  std::__cxx11::string::~string((string *)&local_48);
  __s = detail::buffer<char>::data((buffer<char> *)size);
  sVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,__s,sVar1,local_55);
  std::allocator<char>::~allocator(local_55);
  return __return_storage_ptr__;
}

Assistant:

FMT_NODISCARD auto to_string(const basic_memory_buffer<Char, SIZE>& buf)
    -> std::basic_string<Char> {
  auto size = buf.size();
  detail::assume(size < std::basic_string<Char>().max_size());
  return std::basic_string<Char>(buf.data(), size);
}